

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_edge_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  uint uVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_DBL local_1c0;
  REF_INT local_1b8;
  REF_INT local_1b4;
  REF_DBL local_1b0;
  REF_INT local_1a8;
  REF_INT local_1a4;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL gap;
  REF_DBL xyz [3];
  REF_DBL local_118;
  REF_DBL normal [3];
  REF_DBL radius;
  REF_DBL tvalue;
  REF_DBL *t;
  int local_e0;
  REF_INT jump_geom;
  REF_INT sens;
  REF_INT nedg;
  REF_INT nnode;
  REF_INT node;
  REF_INT local;
  REF_INT item;
  REF_INT nodes [27];
  int local_50;
  int local_4c;
  REF_INT cell;
  REF_INT geom;
  REF_DICT ref_dict;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file_local;
  REF_GRID pRStack_18;
  REF_INT id_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_geom = (REF_GEOM)ref_grid->cell[0];
  ref_dict = (REF_DICT)ref_grid->geom;
  t._4_4_ = -1;
  ref_node = (REF_NODE)file;
  file_local._4_4_ = id;
  pRStack_18 = ref_grid;
  uVar1 = ref_dict_create((REF_DICT *)&cell);
  if (uVar1 == 0) {
    for (local_4c = 0; local_4c < ref_dict->max; local_4c = local_4c + 1) {
      if ((ref_dict->key[local_4c * 6] == 1) &&
         (file_local._4_4_ == ref_dict->key[local_4c * 6 + 1])) {
        uVar1 = ref_dict_store(_cell,ref_dict->key[local_4c * 6 + 5],local_4c);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xb97,"ref_geom_edge_tec_zone",(ulong)uVar1,"mark nodes");
          return uVar1;
        }
        if (ref_dict->key[local_4c * 6 + 3] != 0) {
          if ((long)t._4_4_ != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb99,"ref_geom_edge_tec_zone","should be only one jump per edge",
                   0xffffffffffffffff,(long)t._4_4_);
            return 1;
          }
          t._4_4_ = local_4c;
        }
      }
    }
    sens = _cell->n;
    if (t._4_4_ != -1) {
      sens = sens + 1;
    }
    jump_geom = 0;
    for (local_50 = 0; local_50 < *(int *)((long)&ref_geom->initial_cell_height + 4);
        local_50 = local_50 + 1) {
      RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_50,&local);
      if ((RVar2 == 0) && (file_local._4_4_ == nodes[0])) {
        jump_geom = jump_geom + 1;
      }
    }
    if ((sens == 0) || (jump_geom == 0)) {
      ref_grid_local._4_4_ = ref_dict_free(_cell);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xbaa,"ref_geom_edge_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
      }
    }
    else {
      fprintf((FILE *)ref_node,
              "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)file_local._4_4_,(ulong)(uint)sens,(ulong)(uint)jump_geom,"point","felineseg");
      if (sens < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xbb3,"ref_geom_edge_tec_zone","malloc t of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        tvalue = (REF_DBL)malloc((long)sens << 3);
        if ((void *)tvalue == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xbb3,"ref_geom_edge_tec_zone","malloc t of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (local_50 = 0; local_50 < *(int *)((long)&ref_geom->initial_cell_height + 4);
              local_50 = local_50 + 1) {
            RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_50,&local);
            if ((RVar2 == 0) && (file_local._4_4_ == nodes[0])) {
              uVar1 = ref_dict_location(_cell,local,&nnode);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbba,"ref_geom_edge_tec_zone",(ulong)uVar1,"localize");
                printf("edg %d %d id %d no edge geom\n",(ulong)(uint)local,(ulong)(uint)item,
                       (ulong)(uint)nodes[0]);
                uVar3 = ref_node_location((REF_NODE)ref_cell,local);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,3000,"ref_geom_edge_tec_zone",(ulong)uVar3,"loc");
                  return uVar3;
                }
                uVar3 = ref_geom_tattle((REF_GEOM)ref_dict,local);
                if (uVar3 == 0) {
                  return uVar1;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbb9,"ref_geom_edge_tec_zone",(ulong)uVar3,"tatt");
                return uVar3;
              }
              uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,local,&local,1,&radius,&local_e0);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbbd,"ref_geom_edge_tec_zone",(ulong)uVar1,"from");
                return uVar1;
              }
              if (local_e0 == -1) {
                nnode = sens + -1;
              }
              *(REF_DBL *)((long)tvalue + (long)nnode * 8) = radius;
              uVar1 = ref_dict_location(_cell,item,&nnode);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbc0,"ref_geom_edge_tec_zone",(ulong)uVar1,"localize");
                return uVar1;
              }
              uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,item,&local,1,&radius,&local_e0);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbc3,"ref_geom_edge_tec_zone",(ulong)uVar1,"from");
                return uVar1;
              }
              if (local_e0 == -1) {
                nnode = sens + -1;
              }
              *(REF_DBL *)((long)tvalue + (long)nnode * 8) = radius;
            }
          }
          node = 0;
          if (_cell->n < 1) {
            local_1a4 = -1;
          }
          else {
            local_1a4 = *_cell->key;
          }
          nedg = local_1a4;
          if (_cell->n < 1) {
            local_1a8 = -1;
          }
          else {
            local_1a8 = *_cell->value;
          }
          local_4c = local_1a8;
          while (node < _cell->n) {
            normal[2] = 0.0;
            _ref_private_macro_code_rss_1 = 0.0;
            gap = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf) * 2);
            xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 1) * 2);
            xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 2) * 2);
            if (ref_dict[4].key != (REF_INT *)0x0) {
              uVar1 = ref_egads_edge_curvature((REF_GEOM)ref_dict,local_4c,normal + 2,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbd0,"ref_geom_edge_tec_zone",(ulong)uVar1,"curve");
                return uVar1;
              }
              if (normal[2] <= 0.0) {
                local_1b0 = -normal[2];
              }
              else {
                local_1b0 = normal[2];
              }
              normal[2] = local_1b0;
              uVar1 = ref_egads_eval_at((REF_GEOM)ref_dict,1,file_local._4_4_,
                                        (REF_DBL *)((long)tvalue + (long)node * 8),&gap,
                                        (REF_DBL *)0x0);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbd3,"ref_geom_edge_tec_zone",(ulong)uVar1,"eval at");
                return uVar1;
              }
              uVar1 = ref_egads_gap((REF_GEOM)ref_dict,nedg,(REF_DBL *)&ref_private_macro_code_rss_1
                                   );
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbd4,"ref_geom_edge_tec_zone",(ulong)uVar1,"gap");
                return uVar1;
              }
            }
            fprintf((FILE *)ref_node," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",gap,xyz[0]
                    ,xyz[1],_ref_private_macro_code_rss_1,
                    *(undefined8 *)((long)tvalue + (long)node * 8),0,normal[2]);
            node = node + 1;
            if ((node < 0) || (_cell->n <= node)) {
              local_1b4 = -1;
            }
            else {
              local_1b4 = _cell->key[node];
            }
            nedg = local_1b4;
            if ((node < 0) || (_cell->n <= node)) {
              local_1b8 = -1;
            }
            else {
              local_1b8 = _cell->value[node];
            }
            local_4c = local_1b8;
          }
          if (t._4_4_ != -1) {
            nedg = ref_dict->key[t._4_4_ * 6 + 5];
            normal[2] = 0.0;
            _ref_private_macro_code_rss_1 = 0.0;
            gap = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf) * 2);
            xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 1) * 2);
            xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 2) * 2);
            if (ref_dict[4].key != (REF_INT *)0x0) {
              uVar1 = ref_egads_edge_curvature((REF_GEOM)ref_dict,t._4_4_,normal + 2,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbe2,"ref_geom_edge_tec_zone",(ulong)uVar1,"curve");
                return uVar1;
              }
              if (normal[2] <= 0.0) {
                local_1c0 = -normal[2];
              }
              else {
                local_1c0 = normal[2];
              }
              normal[2] = local_1c0;
              uVar1 = ref_egads_eval_at((REF_GEOM)ref_dict,1,file_local._4_4_,
                                        (REF_DBL *)((long)tvalue + (long)(sens + -1) * 8),&gap,
                                        (REF_DBL *)0x0);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbe6,"ref_geom_edge_tec_zone",(ulong)uVar1,"eval at");
                return uVar1;
              }
              uVar1 = ref_egads_gap((REF_GEOM)ref_dict,nedg,(REF_DBL *)&ref_private_macro_code_rss_1
                                   );
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbe7,"ref_geom_edge_tec_zone",(ulong)uVar1,"gap");
                return uVar1;
              }
            }
            nedg = ref_dict->key[t._4_4_ * 6 + 5];
            fprintf((FILE *)ref_node," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",gap,xyz[0]
                    ,xyz[1],_ref_private_macro_code_rss_1,
                    *(undefined8 *)((long)tvalue + (long)(sens + -1) * 8),0,normal[2]);
          }
          if (tvalue != 0.0) {
            free((void *)tvalue);
          }
          for (local_50 = 0; local_50 < *(int *)((long)&ref_geom->initial_cell_height + 4);
              local_50 = local_50 + 1) {
            RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_50,&local);
            if ((RVar2 == 0) && (file_local._4_4_ == nodes[0])) {
              uVar1 = ref_dict_location(_cell,local,&nnode);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbf1,"ref_geom_edge_tec_zone",(ulong)uVar1,"localize");
                return uVar1;
              }
              uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,local,&local,1,&radius,&local_e0);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbf4,"ref_geom_edge_tec_zone",(ulong)uVar1,"from");
                return uVar1;
              }
              if (local_e0 == -1) {
                nnode = sens + -1;
              }
              fprintf((FILE *)ref_node," %d",(ulong)(nnode + 1));
              uVar1 = ref_dict_location(_cell,item,&nnode);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbf7,"ref_geom_edge_tec_zone",(ulong)uVar1,"localize");
                return uVar1;
              }
              uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,item,&local,1,&radius,&local_e0);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xbfa,"ref_geom_edge_tec_zone",(ulong)uVar1,"from");
                return uVar1;
              }
              if (local_e0 == -1) {
                nnode = sens + -1;
              }
              fprintf((FILE *)ref_node," %d",(ulong)(nnode + 1));
              fprintf((FILE *)ref_node,"\n");
            }
          }
          ref_grid_local._4_4_ = ref_dict_free(_cell);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xc01,"ref_geom_edge_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xb92,
           "ref_geom_edge_tec_zone",(ulong)uVar1,"create dict");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_edge_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nedg, sens;
  REF_INT jump_geom = REF_EMPTY;
  REF_DBL *t, tvalue;
  REF_DBL radius, normal[3], xyz[3], gap;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_edge(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
      if (0 != ref_geom_jump(ref_geom, geom)) {
        REIS(REF_EMPTY, jump_geom, "should be only one jump per edge");
        jump_geom = geom;
      }
    }
  }
  nnode = ref_dict_n(ref_dict);
  if (REF_EMPTY != jump_geom) nnode++;

  nedg = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      nedg++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == nedg) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, nedg, "point", "felineseg");

  ref_malloc(t, nnode, REF_DBL);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSB(ref_dict_location(ref_dict, nodes[0], &local), "localize", {
        printf("edg %d %d id %d no edge geom\n", nodes[0], nodes[1], nodes[2]);
        RSS(ref_node_location(ref_node, nodes[0]), "loc");
        RSS(ref_geom_tattle(ref_geom, nodes[0]), "tatt");
      });
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, geom, &radius, normal), "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[item]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, t[item], 0.0, radius, 0.0);
  }
  if (REF_EMPTY != jump_geom) {
    node = ref_geom_node(ref_geom, jump_geom);
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, jump_geom, &radius, normal),
          "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[nnode - 1]), xyz,
                            NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    node = ref_geom_node(ref_geom, jump_geom);
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, t[nnode - 1], 0.0, radius, 0.0);
  }
  ref_free(t);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSS(ref_dict_location(ref_dict, nodes[0], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}